

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

bool __thiscall
Js::DynamicProfileInfo::GetPolymorphicCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId,
          bool *isConstructorCall,FunctionBody **functionBodyArray,uint functionBodyArrayLength)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  CallSiteInfo **ppCVar6;
  PolymorphicCallSiteInfo **ppPVar7;
  Utf8SourceInfo *pUVar8;
  FunctionBody *pFVar9;
  ScriptContext *this_00;
  SourceList *this_01;
  Type *this_02;
  RecyclerWeakReference<Js::Utf8SourceInfo> *this_03;
  DWORD_PTR DVar10;
  Utf8SourceInfo *srcInfo;
  int j;
  bool found;
  SourceList *sourceList;
  FunctionBody *matchedFunctionBody;
  LocalFunctionId local_50;
  SourceId localSourceId;
  LocalFunctionId localFunctionId;
  uint i;
  PolymorphicCallSiteInfo *polymorphicCallSiteInfo;
  ProfileId callSiteCount;
  FunctionBody **ppFStack_38;
  uint functionBodyArrayLength_local;
  FunctionBody **functionBodyArray_local;
  bool *isConstructorCall_local;
  FunctionBody *pFStack_20;
  ProfileId callSiteId_local;
  FunctionBody *functionBody_local;
  DynamicProfileInfo *this_local;
  
  polymorphicCallSiteInfo._4_4_ = functionBodyArrayLength;
  ppFStack_38 = functionBodyArray;
  functionBodyArray_local = (FunctionBody **)isConstructorCall;
  isConstructorCall_local._6_2_ = callSiteId;
  pFStack_20 = functionBody;
  functionBody_local = (FunctionBody *)this;
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x3b8,"(functionBody)","functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  polymorphicCallSiteInfo._2_2_ = FunctionBody::GetProfiledCallSiteCount(pFStack_20);
  if (polymorphicCallSiteInfo._2_2_ <= isConstructorCall_local._6_2_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x3ba,"(callSiteId < callSiteCount)","callSiteId < callSiteCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = FunctionProxy::IsJsBuiltInCode((FunctionProxy *)pFStack_20);
  if (((!bVar2) && (bVar2 = FunctionProxy::IsPublicLibraryCode((FunctionProxy *)pFStack_20), !bVar2)
      ) && (bVar2 = HasCallSiteInfo(pFStack_20), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x3bb,
                                "(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody))"
                                ,
                                "functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (ppFStack_38 == (FunctionBody **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x3bc,"(functionBodyArray)","functionBodyArray");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (polymorphicCallSiteInfo._4_4_ != 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x3bd,
                                "(functionBodyArrayLength == DynamicProfileInfo::maxPolymorphicInliningSize)"
                                ,
                                "functionBodyArrayLength == DynamicProfileInfo::maxPolymorphicInliningSize"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  *(bool *)functionBodyArray_local =
       (*(ushort *)&(*ppCVar6)[isConstructorCall_local._6_2_].field_0x2 >> 0xd & 1) != 0;
  ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  if ((*(ushort *)&(*ppCVar6)[isConstructorCall_local._6_2_].field_0x2 >> 0xe & 1) == 0) {
    ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callSiteInfo);
    if (*(short *)&(*ppCVar6)[isConstructorCall_local._6_2_].field_0x2 < 0) {
      ppCVar6 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                          ((WriteBarrierPtr *)&this->callSiteInfo);
      ppPVar7 = Memory::WriteBarrierPtr::operator_cast_to_PolymorphicCallSiteInfo__
                          ((WriteBarrierPtr *)
                           &(*ppCVar6)[isConstructorCall_local._6_2_].u.functionData);
      _localFunctionId = *ppPVar7;
      for (localSourceId = 0; localSourceId < polymorphicCallSiteInfo._4_4_;
          localSourceId = localSourceId + 1) {
        bVar2 = PolymorphicCallSiteInfo::GetFunction
                          (_localFunctionId,localSourceId,&local_50,
                           (SourceId *)((long)&matchedFunctionBody + 4));
        if (!bVar2) {
          if (localSourceId < 2) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                        ,0x3ce,"(i >= 2)","We found at least two function Body");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          return true;
        }
        if (matchedFunctionBody._4_4_ == 0xfffffffd) {
          pUVar8 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)pFStack_20);
          pFVar9 = Utf8SourceInfo::FindFunction(pUVar8,local_50);
          if (pFVar9 == (FunctionBody *)0x0) {
            return false;
          }
          ppFStack_38[localSourceId] = pFVar9;
        }
        else {
          if ((matchedFunctionBody._4_4_ == 0xffffffff) || (matchedFunctionBody._4_4_ == 0xfffffffc)
             ) {
            return false;
          }
          this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)pFStack_20);
          this_01 = ScriptContext::GetSourceList(this_00);
          bVar2 = false;
          srcInfo._0_4_ = 0;
          while( true ) {
            iVar4 = JsUtil::
                    ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                    ::Count(&this_01->
                             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                           );
            bVar3 = false;
            if ((int)srcInfo < iVar4) {
              bVar3 = (bool)(bVar2 ^ 1);
            }
            if (!bVar3) break;
            bVar3 = JsUtil::
                    List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                    ::IsItemValid(this_01,(int)srcInfo);
            if (bVar3) {
              this_02 = JsUtil::
                        List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
                        ::Item(this_01,(int)srcInfo);
              this_03 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_>
                        ::operator->(this_02);
              pUVar8 = Memory::RecyclerWeakReference<Js::Utf8SourceInfo>::Get(this_03);
              if ((pUVar8 != (Utf8SourceInfo *)0x0) &&
                 (DVar10 = Utf8SourceInfo::GetHostSourceContext(pUVar8),
                 DVar10 == matchedFunctionBody._4_4_)) {
                pFVar9 = Utf8SourceInfo::FindFunction(pUVar8,local_50);
                if (pFVar9 == (FunctionBody *)0x0) {
                  return false;
                }
                ppFStack_38[localSourceId] = pFVar9;
                bVar2 = true;
              }
            }
            srcInfo._0_4_ = (int)srcInfo + 1;
          }
          if (!bVar2) {
            return false;
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicProfileInfo::GetPolymorphicCallSiteInfo(FunctionBody* functionBody, ProfileId callSiteId, bool *isConstructorCall, __inout_ecount(functionBodyArrayLength) FunctionBody** functionBodyArray, uint functionBodyArrayLength)
    {
        Assert(functionBody);
        const auto callSiteCount = functionBody->GetProfiledCallSiteCount();
        Assert(callSiteId < callSiteCount);
        Assert(functionBody->IsJsBuiltInCode() || functionBody->IsPublicLibraryCode() || HasCallSiteInfo(functionBody));
        Assert(functionBodyArray);
        Assert(functionBodyArrayLength == DynamicProfileInfo::maxPolymorphicInliningSize);

        *isConstructorCall = callSiteInfo[callSiteId].isConstructorCall;
        if (callSiteInfo[callSiteId].dontInline)
        {
            return false;
        }
        if (callSiteInfo[callSiteId].isPolymorphic)
        {
            PolymorphicCallSiteInfo *polymorphicCallSiteInfo = callSiteInfo[callSiteId].u.polymorphicCallSiteInfo;

            for (uint i = 0; i < functionBodyArrayLength; i++)
            {
                Js::LocalFunctionId localFunctionId;
                Js::SourceId localSourceId;
                if (!polymorphicCallSiteInfo->GetFunction(i, &localFunctionId, &localSourceId))
                {
                    AssertMsg(i >= 2, "We found at least two function Body");
                    return true;
                }

                FunctionBody* matchedFunctionBody;

                if (localSourceId == CurrentSourceId)  // caller and callee in same file
                {
                    matchedFunctionBody = functionBody->GetUtf8SourceInfo()->FindFunction(localFunctionId);
                    if (!matchedFunctionBody)
                    {
                        return false;
                    }
                    functionBodyArray[i] = matchedFunctionBody;
                }
                else if (localSourceId == NoSourceId || localSourceId == InvalidSourceId)
                {
                    return false;
                }
                else
                {
                    // For call across files find the function from the right source
                    typedef JsUtil::List<RecyclerWeakReference<Utf8SourceInfo>*, Recycler, false, Js::FreeListedRemovePolicy> SourceList;
                    SourceList * sourceList = functionBody->GetScriptContext()->GetSourceList();
                    bool found = false;
                    for (int j = 0; j < sourceList->Count() && !found; j++)
                    {
                        if (sourceList->IsItemValid(j))
                        {
                            Utf8SourceInfo *srcInfo = sourceList->Item(j)->Get();
                            if (srcInfo && srcInfo->GetHostSourceContext() == localSourceId)
                            {
                                matchedFunctionBody = srcInfo->FindFunction(localFunctionId);
                                if (!matchedFunctionBody)
                                {
                                    return false;
                                }
                                functionBodyArray[i] = matchedFunctionBody;
                                found = true;
                            }
                        }
                    }
                    if (!found)
                    {
                        return false;
                    }
                }
            }
            return true;
        }
        return false;
    }